

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

size_t Memory::LargeHeapBlock::GetPagesNeeded(size_t size,bool multiplyRequest)

{
  size_t sVar1;
  size_t pageCount;
  uint pageSize;
  bool multiplyRequest_local;
  size_t size_local;
  
  _pageSize = size;
  if (multiplyRequest) {
    _pageSize = AllocSizeMath::Mul(size,4);
  }
  sVar1 = AllocSizeMath::Add(_pageSize,0x101f);
  if (sVar1 == 0xffffffffffffffff) {
    size_local = 0;
  }
  else {
    size_local = sVar1 / 0x1000;
  }
  return size_local;
}

Assistant:

size_t
LargeHeapBlock::GetPagesNeeded(DECLSPEC_GUARD_OVERFLOW size_t size, bool multiplyRequest)
{
    if (multiplyRequest)
    {
        size = AllocSizeMath::Mul(size, 4);
    }

    uint pageSize = AutoSystemInfo::PageSize;
    size = AllocSizeMath::Add(size, sizeof(LargeObjectHeader) + (pageSize - 1));
    if (size == (size_t)-1)
    {
        return 0;
    }
    size_t pageCount = size / pageSize;
    return pageCount;
}